

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O2

MouseEventResult __thiscall
QMenuSloppyState::processMouseEvent
          (QMenuSloppyState *this,QPointF *mousePos,QAction *resetAction,QAction *currentAction)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  QAction **ppQVar6;
  qreal qVar7;
  QAction **ppQVar8;
  qreal qVar9;
  qreal qVar10;
  qreal qVar11;
  qreal qVar12;
  qreal qVar13;
  ulong uVar14;
  bool bVar15;
  char cVar16;
  byte bVar17;
  uint uVar18;
  LayoutDirection LVar19;
  qsizetype qVar20;
  qsizetype qVar21;
  int iVar22;
  short sVar23;
  MouseEventResult MVar24;
  ulong uVar25;
  uint uVar26;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_58;
  QAction *resetAction_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  resetAction_local = resetAction;
  if (this->m_parent != (QMenuSloppyState *)0x0) {
    QBasicTimer::stop();
  }
  MVar24 = EventShouldBePropagated;
  if ((this->field_0x6c & 1) == 0) goto LAB_00428a1d;
  startTimerIfNotRunning(this);
  bVar15 = QPointer::operator_cast_to_bool((QPointer *)&this->m_sub_menu);
  if (!bVar15) {
    reset(this);
    goto LAB_00428a1d;
  }
  qVar12 = mousePos->xp;
  qVar13 = mousePos->yp;
  if ((resetAction == (QAction *)0x0) || (cVar16 = QAction::isSeparator(), cVar16 == '\0')) {
    if (this->m_reset_action != resetAction) {
      if ((resetAction != (QAction *)0x0) && ((this->field_0x6c & 0x20) != 0)) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
        QWidget::actions((QList<QAction_*> *)&local_58,&this->m_menu->super_QWidget);
        qVar20 = QtPrivate::indexOf<QAction*,QAction*>
                           ((QList<QAction_*> *)&local_58,&resetAction_local,0);
        qVar21 = QtPrivate::indexOf<QAction*,QAction*>
                           ((QList<QAction_*> *)&local_58,&this->m_origin_action,0);
        if (-1 < (int)((uint)qVar21 | (uint)qVar20)) {
          uVar26 = (uint)qVar20 - (uint)qVar21;
          uVar18 = -uVar26;
          if (0 < (int)uVar26) {
            uVar18 = uVar26;
          }
          if (1 < uVar18) {
            this->field_0x6c = this->field_0x6c & 0xdf;
          }
        }
        QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_58);
        resetAction = resetAction_local;
      }
      this->m_reset_action = resetAction;
    }
  }
  else {
    this->m_reset_action = (QAction *)0x0;
    this->field_0x6c = this->field_0x6c | 0x20;
  }
  cVar16 = QRectF::contains((QPointF *)&this->m_action_rect);
  if (cVar16 == '\0') {
    bVar17 = this->field_0x6c;
    if ((((bVar17 & 2) != 0) && (this->m_first_mouse == false)) &&
       (resetAction_local != this->m_origin_action)) {
      LVar19 = QWidget::layoutDirection(&this->m_menu->super_QWidget);
      lVar2 = *(long *)((this->m_sub_menu).wp.value + 0x20);
      uVar3 = *(ulong *)(lVar2 + 0x14);
      uVar4 = *(ulong *)(lVar2 + 0x1c);
      uVar25 = uVar4 & 0xffffffff00000000;
      uVar14 = uVar4;
      if (LVar19 == LeftToRight) {
        uVar4 = uVar3;
        uVar14 = uVar3 & 0xffffffff | uVar25;
      }
      ppQVar6 = (QAction **)(double)(int)(uVar3 >> 0x20);
      local_58.d = (Data *)(double)(int)uVar4;
      local_58.ptr = ppQVar6;
      qVar7 = slope(&this->m_previous_point,(QPointF *)&local_58);
      ppQVar8 = (QAction **)(double)(int)(uVar14 >> 0x20);
      local_58.d = (Data *)(double)(int)uVar14;
      local_58.ptr = ppQVar8;
      qVar9 = slope(&this->m_previous_point,(QPointF *)&local_58);
      local_58.d = (Data *)(double)(int)uVar4;
      local_58.ptr = ppQVar6;
      qVar10 = slope(mousePos,(QPointF *)&local_58);
      local_58.d = (Data *)(double)(int)uVar14;
      local_58.ptr = ppQVar8;
      qVar11 = slope(mousePos,(QPointF *)&local_58);
      dVar1 = mousePos->yp;
      bVar15 = qVar10 <= qVar7;
      if ((double)ppQVar6 < dVar1) {
        bVar15 = qVar7 <= qVar10;
      }
      bVar5 = qVar11 <= qVar9;
      if (dVar1 < (double)ppQVar8) {
        bVar5 = qVar9 <= qVar11;
      }
      iVar22 = (int)((this->m_previous_point).yp - dVar1);
      bVar15 = (bool)(iVar22 < 1 & bVar5 | -1 < iVar22 & bVar15);
      if ((this->m_uni_dir_fail_at_count <= this->m_uni_dir_discarded_count) && (!bVar15)) {
        this->m_uni_dir_discarded_count = 0;
        MVar24 = EventDiscardsSloppyState;
        goto LAB_00428a10;
      }
      sVar23 = 0;
      if (!bVar15) {
        sVar23 = this->m_uni_dir_discarded_count + 1;
      }
      this->m_uni_dir_discarded_count = sVar23;
      bVar17 = this->field_0x6c;
    }
    MVar24 = (MouseEventResult)(bVar17 >> 2 & 1);
  }
  else {
    startTimer(this);
    MVar24 = (MouseEventResult)
             (*(QAction **)(*(long *)&(this->m_menu->super_QWidget).field_0x8 + 0x3a8) !=
             currentAction);
  }
LAB_00428a10:
  (this->m_previous_point).xp = qVar12;
  (this->m_previous_point).yp = qVar13;
  this->m_first_mouse = false;
LAB_00428a1d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return MVar24;
  }
  __stack_chk_fail();
}

Assistant:

MouseEventResult processMouseEvent(const QPointF &mousePos, QAction *resetAction, QAction *currentAction)
    {
        if (m_parent)
            m_parent->stopTimer();

        if (!m_enabled)
            return EventShouldBePropagated;

        startTimerIfNotRunning();

        if (!m_sub_menu) {
            reset();
            return EventShouldBePropagated;
        }

        QSetValueOnDestroy<bool> setFirstMouse(m_first_mouse, false);
        QSetValueOnDestroy<QPointF> setPreviousPoint(m_previous_point, mousePos);

        if (resetAction && resetAction->isSeparator()) {
            m_reset_action = nullptr;
            m_use_reset_action = true;
        } else if (m_reset_action != resetAction) {
            if (m_use_reset_action && resetAction) {
                const QList<QAction *> actions = m_menu->actions();
                const int resetIdx  = actions.indexOf(resetAction);
                const int originIdx = actions.indexOf(m_origin_action);
                if (resetIdx > -1 && originIdx > -1 && qAbs(resetIdx - originIdx) > 1)
                    m_use_reset_action = false;
            }
            m_reset_action = resetAction;
        }

        if (m_action_rect.contains(mousePos)) {
            startTimer();
            return currentAction == m_menu->menuAction() ? EventIsProcessed : EventShouldBePropagated;
        }

        if (m_uni_directional && !m_first_mouse && resetAction != m_origin_action) {
            bool left_to_right = m_menu->layoutDirection() == Qt::LeftToRight;
            QRect sub_menu_rect = m_sub_menu->geometry();
            QPoint sub_menu_top =
                    left_to_right? sub_menu_rect.topLeft() : sub_menu_rect.topRight();
            QPoint sub_menu_bottom =
                    left_to_right? sub_menu_rect.bottomLeft() : sub_menu_rect.bottomRight();
            qreal prev_slope_top = slope(m_previous_point, sub_menu_top);
            qreal prev_slope_bottom = slope(m_previous_point, sub_menu_bottom);

            qreal current_slope_top = slope(mousePos, sub_menu_top);
            qreal current_slope_bottom = slope(mousePos, sub_menu_bottom);

            bool slopeTop = checkSlope(prev_slope_top, current_slope_top, sub_menu_top.y() < mousePos.y());
            bool slopeBottom = checkSlope(prev_slope_bottom, current_slope_bottom, sub_menu_bottom.y() > mousePos.y());
            bool rightDirection = false;
            int mouseDir = int(m_previous_point.y() - mousePos.y());
            if (mouseDir >= 0) {
                rightDirection = rightDirection || slopeTop;
            }
            if (mouseDir <= 0) {
                rightDirection = rightDirection || slopeBottom;
            }

            if (m_uni_dir_discarded_count >= m_uni_dir_fail_at_count && !rightDirection) {
                m_uni_dir_discarded_count = 0;
                return EventDiscardsSloppyState;
            }

            if (!rightDirection)
                m_uni_dir_discarded_count++;
            else
                m_uni_dir_discarded_count = 0;

        }

        return m_select_other_actions ? EventShouldBePropagated : EventIsProcessed;
    }